

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_example.cpp
# Opt level: O3

int main(void)

{
  undefined1 *puVar1;
  ulong uVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [64];
  undefined4 uVar8;
  uint uVar9;
  void *pvVar10;
  unsigned_long uVar11;
  pointer pBVar12;
  long lVar13;
  pointer pBVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ostream *poVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  size_t j;
  ulong uVar24;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  ulong uVar25;
  code *__new_size;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  bool bVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp_00;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tris;
  SequentialExecutor executor;
  vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
  precomputed_tris;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  mini_trees;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> bvh;
  ThreadPool thread_pool;
  void *local_3b8;
  void *pvStack_3b0;
  long local_3a8;
  undefined1 local_398 [8];
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  undefined8 uStack_380;
  ThreadPool *local_378;
  __extent_storage<18446744073709551615UL> local_370;
  _Any_data *local_368;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_358;
  undefined1 local_338 [8];
  pointer pBStack_330;
  pointer local_328;
  pointer local_318;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  ulong local_300;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> local_2f8;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> local_2e0;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_2c8;
  _Any_data local_298;
  code *pcStack_288;
  ThreadPool *pTStack_280;
  ulong local_278;
  undefined8 local_270;
  vector<bool,_std::allocator<bool>_> local_268;
  vector<float,_std::allocator<float>_> vStack_240;
  undefined1 auStack_228 [32];
  undefined1 auStack_208 [40];
  uint local_198;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_188;
  Config local_168;
  int local_140;
  undefined8 local_138;
  undefined1 local_128 [8];
  __native_type local_120;
  pointer local_f8;
  pointer local_f0;
  unique_lock local_b0 [48];
  deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
  local_80 [16];
  _Elt_pointer local_70;
  _Elt_pointer local_50;
  
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = 0x3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  local_3a8 = 0;
  local_3b8 = (void *)0x0;
  pvStack_3b0 = (void *)0x0;
  local_298._M_unused._M_object = (void *)0xbf8000003f800000;
  local_298._8_4_ = 0x3f800000;
  local_128 = (undefined1  [8])vmovlps_avx(auVar36);
  local_120.__data.__lock = 0x3f800000;
  local_398 = (undefined1  [8])0x3f800000bf800000;
  uStack_390._0_4_ = 1.0;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&local_3b8,
             (Vec<float,_3UL> *)&local_298,(Vec<float,_3UL> *)local_128,(Vec<float,_3UL> *)local_398
            );
  auVar37._8_4_ = 0xbf800000;
  auVar37._0_8_ = 0xbf800000bf800000;
  auVar37._12_4_ = 0xbf800000;
  local_298._M_unused._M_object = (void *)0xbf8000003f800000;
  local_398 = (undefined1  [8])0x3f800000bf800000;
  local_298._8_4_ = 0x3f800000;
  uStack_390._0_4_ = 1.0;
  local_128 = (undefined1  [8])vmovlps_avx(auVar37);
  local_120.__data.__lock = 0x3f800000;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&local_3b8,
             (Vec<float,_3UL> *)&local_298,(Vec<float,_3UL> *)local_128,(Vec<float,_3UL> *)local_398
            );
  ::bvh::v2::ThreadPool::ThreadPool((ThreadPool *)local_128,0);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&local_2e0,((long)pvStack_3b0 - (long)local_3b8 >> 2) * -0x71c71c71c71c71c7,
             (allocator_type *)local_298._M_pod_data);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&local_2f8,((long)pvStack_3b0 - (long)local_3b8 >> 2) * -0x71c71c71c71c71c7,
             (allocator_type *)local_298._M_pod_data);
  uVar25 = ((long)pvStack_3b0 - (long)local_3b8 >> 2) * -0x71c71c71c71c71c7;
  if (uVar25 < 0x400) {
    if (pvStack_3b0 != local_3b8) {
      lVar16 = 0x10;
      lVar20 = 0;
      do {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)local_3b8 + lVar16 * 2 + -0x20);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)local_3b8 + lVar16 * 2 + -0x14);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)local_3b8 + lVar16 * 2 + -8);
        auVar36 = ZEXT416(*(uint *)((long)local_3b8 + lVar16 * 2 + -0x18));
        auVar37 = ZEXT416(*(uint *)((long)local_3b8 + lVar16 * 2 + -0xc));
        auVar40 = vminss_avx(auVar36,auVar37);
        auVar37 = vmaxss_avx(auVar36,auVar37);
        uVar19 = *(uint *)((long)local_3b8 + lVar16 * 2);
        auVar36 = vmaxps_avx(auVar38,auVar43);
        auVar38 = vminps_avx(auVar38,auVar43);
        auVar38 = vminps_avx(auVar38,auVar46);
        auVar36 = vmaxps_avx(auVar36,auVar46);
        uVar4 = vmovlps_avx(auVar38);
        *(undefined8 *)
         ((long)((local_2e0.
                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar20 * 2) = uVar4;
        auVar43 = ZEXT416(uVar19);
        auVar38 = vminss_avx(auVar40,auVar43);
        auVar37 = vmaxss_avx(auVar37,auVar43);
        *(int *)((long)((local_2e0.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar20 * 2 + -4)
             = auVar38._0_4_;
        uVar4 = vmovlps_avx(auVar36);
        *(undefined8 *)
         ((long)((local_2e0.
                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar20 * 2) = uVar4;
        *(int *)((long)((local_2e0.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar20 * 2 + 8) =
             auVar37._0_4_;
        fVar31 = *(float *)((long)local_3b8 + lVar16 * 2 + -0x18);
        uVar4 = *(undefined8 *)((long)local_3b8 + lVar16 * 2 + -0x20);
        uVar5 = *(undefined8 *)((long)local_3b8 + lVar16 * 2 + -0x14);
        uVar6 = *(undefined8 *)((long)local_3b8 + lVar16 * 2 + -8);
        fVar30 = *(float *)((long)local_3b8 + lVar16 * 2 + -0xc);
        fVar33 = *(float *)((long)local_3b8 + lVar16 * 2);
        lVar16 = lVar16 + 0x12;
        auVar40._0_4_ = ((float)uVar4 + (float)uVar5 + (float)uVar6) * 0.33333334;
        auVar40._4_4_ =
             ((float)((ulong)uVar4 >> 0x20) + (float)((ulong)uVar5 >> 0x20) +
             (float)((ulong)uVar6 >> 0x20)) * 0.33333334;
        auVar40._8_8_ = 0;
        uVar4 = vmovlps_avx(auVar40);
        *(undefined8 *)
         ((long)&((__mutex_base *)
                 (local_2f8.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->values)->_M_mutex + lVar20) = uVar4;
        *(float *)((long)&(((mutex *)
                           ((long)local_2f8.
                                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))->
                          super___mutex_base)._M_mutex + lVar20) =
             (fVar31 + fVar30 + fVar33) * 0.33333334;
        lVar20 = lVar20 + 0xc;
        uVar25 = uVar25 - 1;
      } while (uVar25 != 0);
    }
  }
  else {
    uVar17 = uVar25 / (ulong)((long)local_f0 - (long)local_f8 >> 3);
    uVar24 = 0;
    do {
      local_298._M_unused._M_object = (void *)0x0;
      local_298._8_8_ = 0;
      pcStack_288 = (code *)0x0;
      pTStack_280 = (ThreadPool *)0x0;
      local_298._M_unused._M_object = operator_new(0x28);
      uVar2 = uVar24 + uVar17 + (uVar17 == 0);
      *(vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> **)
       local_298._M_unused._0_8_ = &local_2e0;
      *(void ***)((long)local_298._M_unused._0_8_ + 8) = &local_3b8;
      uVar21 = uVar25;
      if (uVar2 < uVar25) {
        uVar21 = uVar2;
      }
      *(vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> **)
       ((long)local_298._M_unused._0_8_ + 0x10) = &local_2f8;
      *(ulong *)((long)local_298._M_unused._0_8_ + 0x18) = uVar24;
      *(ulong *)((long)local_298._M_unused._0_8_ + 0x20) = uVar21;
      pTStack_280 = (ThreadPool *)
                    std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_invoke;
      local_398 = (undefined1  [8])(local_128 + 8);
      pcStack_288 = std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_manager;
      uStack_390 = uStack_390 & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_398);
      uStack_390._0_1_ = 1;
      std::
      deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>::
      emplace_back<std::function<void(unsigned_long)>>
                (local_80,(function<void_(unsigned_long)> *)&local_298);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_398);
      std::condition_variable::notify_one();
      if (pcStack_288 != (code *)0x0) {
        (*pcStack_288)(&local_298,&local_298,3);
      }
      uVar24 = uVar2;
    } while (uVar2 < uVar25);
    local_298._M_unused._0_8_ = (undefined8)(local_128 + 8);
    local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_298);
    local_298._M_pod_data[8] = 1;
    while( true ) {
      if (((float)local_128._0_4_ == 0.0) && (local_50 == local_70)) break;
      std::condition_variable::wait(local_b0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_298);
  }
  local_168.sah.log_cluster_size_ = 0;
  local_168.sah.prim_offset_ = 0;
  local_168.sah.cost_ratio_ = 1.0;
  local_168.min_leaf_size = 1;
  local_168.max_leaf_size = 8;
  local_138 = 0x400;
  local_140 = 2;
  lVar16 = (long)local_2f8.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_2f8.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2;
  __new_size = (code *)(((long)local_2e0.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2e0.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       );
  uVar25 = lVar16 * -0x5555555555555555;
  if (__new_size < (code *)0x400) {
    local_398 = (undefined1  [8])
                local_2f8.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_298._M_unused._M_object = &PTR___cxa_pure_virtual_00115cf8;
    local_298._8_8_ =
         local_2e0.
         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pTStack_280 = (ThreadPool *)
                  local_2f8.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_270 = &local_168;
    uStack_390 = uVar25;
    pcStack_288 = __new_size;
    local_278 = uVar25;
    if (__new_size + lVar16 * 0x5555555555555555 != (code *)0x0) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                    ,0x3f,
                    "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                   );
    }
    auStack_228._8_24_ = SUB6424(ZEXT464(0),0) << 0x40;
    local_298._M_unused._M_object = &PTR_get_prim_ids_00115d18;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         (ulong)(uint)local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    auStack_228._0_8_ = 0;
    auStack_208 = (undefined1  [40])0x0;
    std::vector<bool,_std::allocator<bool>_>::resize(&local_268,(size_type)__new_size,false);
    std::vector<float,_std::allocator<float>_>::resize(&vStack_240,(size_type)__new_size);
    local_358.
    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (auStack_228 +
                 (long)local_358.
                       super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start * 0x18),(size_type)__new_size);
      __first._M_current =
           *(unsigned_long **)
            (auStack_228 +
            (long)local_358.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start * 0x18);
      __last._M_current =
           *(unsigned_long **)
            (auStack_228 +
            (long)local_358.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start * 0x18 + 8);
      if (__first._M_current != __last._M_current) {
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar28 = vpbroadcastq_avx512f(ZEXT816(8));
        uVar25 = 0;
        auVar29 = vpbroadcastq_avx512f();
        auVar29 = vpsrlq_avx512f(auVar29,3);
        do {
          vpcmpuq_avx512f(auVar27,auVar29,2);
          auVar7 = vmovdqu64_avx512f(auVar27);
          *(undefined1 (*) [64])(__first._M_current + uVar25) = auVar7;
          uVar25 = uVar25 + 8;
          auVar27 = vpaddq_avx512f(auVar27,auVar28);
        } while ((((ulong)((long)__last._M_current + (-8 - (long)__first._M_current)) >> 3) + 8 &
                 0xfffffffffffffff8) != uVar25);
        __first._M_current =
             *(unsigned_long **)
              (auStack_228 +
              (long)local_358.
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start * 0x18);
        __last._M_current =
             *(unsigned_long **)
              (auStack_228 +
              (long)local_358.
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start * 0x18 + 8);
      }
      if (__first._M_current != __last._M_current) {
        __comp._M_comp.axis = (size_t *)&local_358;
        __comp._M_comp.centers =
             (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)local_398;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,
                   (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >>
                                              3) * 2) ^ 0x7e,__comp);
        __comp_00._M_comp.axis = (size_t *)&local_358;
        __comp_00._M_comp.centers =
             (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)local_398;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,__comp_00);
      }
      local_358.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_358.
                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_358.
             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < (pointer)0x3);
    ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
              (&local_2c8,(TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&local_298);
    lVar16 = 0xb0;
    local_298._M_unused._M_object = &PTR_get_prim_ids_00115d18;
    do {
      pvVar10 = *(void **)((long)&local_2c8.prim_ids.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + lVar16);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,*(long *)((long)&local_298 + lVar16) - (long)pvVar10);
      }
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != 0x68);
    if (vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_140 == 2) {
      local_298._0_4_ = 0x3d4ccccd;
      local_298._8_8_ = (void *)0x3;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
      optimize<bvh::v2::SequentialExecutor>
                ((Executor<bvh::v2::SequentialExecutor> *)local_398,&local_2c8,(Config *)&local_298)
      ;
    }
  }
  else {
    local_298._M_unused._M_object = (undefined **)0x0;
    local_298._8_8_ = (void *)0x0;
    pcStack_288 = (code *)CONCAT44(local_168.sah._20_4_,0x3f800000);
    pTStack_280 = (ThreadPool *)0x1;
    local_278 = 8;
    local_270 = (Config *)CONCAT71(local_270._1_7_,1);
    local_270 = (Config *)CONCAT44(0x3c23d70a,(undefined4)local_270);
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x400;
    uStack_390 = 0x400;
    local_388 = SUB84(local_2e0.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0);
    fStack_384 = (float)((ulong)local_2e0.
                                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    local_378 = (ThreadPool *)
                local_2f8.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_268.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 4;
    local_398 = (undefined1  [8])local_128;
    local_370._M_extent_value = uVar25;
    local_368 = &local_298;
    uStack_380 = (size_t)__new_size;
    if (__new_size + lVar16 * 0x5555555555555555 != (code *)0x0) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                    ,0x9d,
                    "bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::MiniTreeBuilder(ThreadPool &, std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                   );
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_mini_trees
              ((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_338,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_398);
    if ((char)local_270 == '\x01') {
      ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::
      prune_mini_trees(&local_188,
                       (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)
                       local_398,
                       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)local_338);
      pBVar12 = local_188.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_358.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
      local_358.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pBStack_330;
      local_358.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_338;
      local_188.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_328 = pBVar12;
      local_338 = (undefined1  [8])
                  local_188.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pBStack_330 = local_188.
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_188.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_358);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_188);
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
              (&local_2c8,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_398,
               (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_338);
    std::
    vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::~vector((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               *)local_338);
    if (local_140 == 2) {
      local_398._0_4_ = 0x3d4ccccd;
      uStack_390 = 3;
      local_298._8_8_ = (void *)0x400;
      local_298._M_unused._M_object = (ThreadPool *)local_128;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
      optimize<bvh::v2::ParallelExecutor>
                ((Executor<bvh::v2::ParallelExecutor> *)local_298._M_pod_data,&local_2c8,
                 (Config *)local_398);
    }
  }
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  vector((vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_> *
         )&local_358,((long)pvStack_3b0 - (long)local_3b8 >> 2) * -0x71c71c71c71c71c7,
         (allocator_type *)local_298._M_pod_data);
  uVar25 = ((long)pvStack_3b0 - (long)local_3b8 >> 2) * -0x71c71c71c71c71c7;
  if (uVar25 < 0x400) {
    if (pvStack_3b0 != local_3b8) {
      lVar16 = 0x2c;
      lVar20 = 0;
      do {
        uVar11 = local_2c8.prim_ids.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20];
        lVar20 = lVar20 + 1;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)local_3b8 + uVar11 * 0x24);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)local_3b8 + uVar11 * 0x24 + 0xc);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)local_3b8 + uVar11 * 0x24 + 0x18);
        fVar31 = *(float *)((long)local_3b8 + uVar11 * 0x24 + 8);
        fVar33 = fVar31 - *(float *)((long)local_3b8 + uVar11 * 0x24 + 0x14);
        auVar38 = vsubps_avx(auVar39,auVar41);
        auVar40 = vsubps_avx(auVar44,auVar39);
        fVar30 = *(float *)((long)local_3b8 + uVar11 * 0x24 + 0x20);
        uVar8 = *(undefined4 *)((long)local_3b8 + uVar11 * 0x24 + 8);
        *(undefined8 *)
         ((long)local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x2c) =
             *(undefined8 *)((long)local_3b8 + uVar11 * 0x24);
        auVar36 = vmovshdup_avx(auVar38);
        *(undefined4 *)
         ((long)local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x24) = uVar8;
        uVar4 = vmovlps_avx(auVar38);
        *(undefined8 *)
         ((long)local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x20) = uVar4;
        *(float *)((long)local_358.
                         super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x18) = fVar33;
        uVar4 = vmovlps_avx(auVar40);
        *(undefined8 *)
         ((long)local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x14) = uVar4;
        fVar30 = fVar30 - fVar31;
        auVar37 = vmovshdup_avx(auVar40);
        *(float *)((long)local_358.
                         super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0xc) = fVar30;
        auVar43 = vfmsub231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar33)),auVar36,
                                  ZEXT416((uint)fVar30));
        auVar46 = vfmsub231ss_fma(ZEXT416((uint)(fVar30 * auVar38._0_4_)),ZEXT416((uint)fVar33),
                                  auVar40);
        auVar37 = vfmsub231ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar36._0_4_)),auVar38,auVar37);
        auVar36 = vinsertps_avx(auVar43,auVar46,0x10);
        uVar4 = vmovlps_avx(auVar36);
        *(undefined8 *)
         ((long)local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) = uVar4;
        *(int *)((long)&((local_358.
                          super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->nodes).
                        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar16) = auVar37._0_4_;
        lVar16 = lVar16 + 0x30;
      } while (uVar25 - lVar20 != 0);
    }
  }
  else {
    uVar17 = uVar25 / (ulong)((long)local_f0 - (long)local_f8 >> 3);
    uVar24 = 0;
    do {
      local_298._M_unused._M_object = (void *)0x0;
      local_298._8_8_ = 0;
      pcStack_288 = (code *)0x0;
      pTStack_280 = (ThreadPool *)0x0;
      local_298._M_unused._M_object = operator_new(0x28);
      uVar2 = uVar24 + uVar17 + (uVar17 == 0);
      *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)local_298._M_unused._0_8_ = &local_2c8;
      uVar21 = uVar25;
      if (uVar2 < uVar25) {
        uVar21 = uVar2;
      }
      *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        **)((long)local_298._M_unused._0_8_ + 8) = &local_358;
      *(void ***)((long)local_298._M_unused._0_8_ + 0x10) = &local_3b8;
      *(ulong *)((long)local_298._M_unused._0_8_ + 0x18) = uVar24;
      *(ulong *)((long)local_298._M_unused._0_8_ + 0x20) = uVar21;
      pTStack_280 = (ThreadPool *)
                    std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_invoke;
      local_398 = (undefined1  [8])(local_128 + 8);
      pcStack_288 = std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_manager;
      uStack_390 = uStack_390 & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_398);
      uStack_390._0_1_ = 1;
      std::
      deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>::
      emplace_back<std::function<void(unsigned_long)>>
                (local_80,(function<void_(unsigned_long)> *)&local_298);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_398);
      std::condition_variable::notify_one();
      if (pcStack_288 != (code *)0x0) {
        (*pcStack_288)(&local_298,&local_298,3);
      }
      uVar24 = uVar2;
    } while (uVar2 < uVar25);
    local_298._M_unused._0_8_ = (undefined8)(local_128 + 8);
    local_298._8_8_ = local_298._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_298);
    local_298._M_pod_data[8] = 1;
    while (((float)local_128._0_4_ != 0.0 || (local_50 != local_70))) {
      std::condition_variable::wait(local_b0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_298);
  }
  local_198 = 1;
  local_300 = 0xffffffffffffffff;
  local_398 = (undefined1  [8])0x0;
  uStack_390 = 0;
  local_388 = 0.0;
  uVar4 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  fStack_384 = (float)uVar4;
  uStack_380._0_4_ = (float)((ulong)uVar4 >> 0x20);
  uStack_380._4_4_ = 100.0;
  local_298._0_4_ =
       ((local_2c8.nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  do {
    auVar34._4_4_ = (float)uStack_380;
    auVar34._0_4_ = (float)uStack_380;
    auVar34._8_4_ = (float)uStack_380;
    auVar34._12_4_ = (float)uStack_380;
LAB_00103069:
    local_198 = local_198 - 1;
    uVar19 = *(uint *)((long)&local_298 + (ulong)local_198 * 4);
LAB_00103079:
    if ((uVar19 & 0xf) == 0) {
      uVar25 = (ulong)(uVar19 >> 4);
      auVar36 = vinsertps_avx(ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds
                                            ._M_elems[4]),
                              ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                            bounds._M_elems[4]),0x10);
      auVar37 = vminss_avx(ZEXT416((uint)(local_2c8.nodes.
                                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds.
                                          _M_elems[1] * 3.4028235e+38)),
                           ZEXT416((uint)uStack_380._4_4_));
      auVar37 = vminss_avx(ZEXT416((uint)(local_2c8.nodes.
                                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds.
                                          _M_elems[3] * 3.4028235e+38)),auVar37);
      auVar40 = vminss_avx(ZEXT416((uint)local_2c8.nodes.
                                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds.
                                         _M_elems[5]),auVar37);
      auVar37 = vminss_avx(ZEXT416((uint)(local_2c8.nodes.
                                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                          bounds._M_elems[1] * 3.4028235e+38)),
                           ZEXT416((uint)uStack_380._4_4_));
      auVar38 = vminss_avx(ZEXT416((uint)(local_2c8.nodes.
                                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                          bounds._M_elems[3] * 3.4028235e+38)),auVar37);
      auVar37 = vinsertps_avx(ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds
                                            ._M_elems[2]),
                              ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                            bounds._M_elems[2]),0x10);
      auVar43 = vminss_avx(ZEXT416((uint)local_2c8.nodes.
                                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                         bounds._M_elems[5]),auVar38);
      auVar38 = vinsertps_avx(ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25].bounds
                                            ._M_elems[0]),
                              ZEXT416((uint)local_2c8.nodes.
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].
                                            bounds._M_elems[0]),0x10);
      auVar45._0_4_ = auVar37._0_4_ * 3.4028235e+38;
      auVar45._4_4_ = auVar37._4_4_ * 3.4028235e+38;
      auVar45._8_4_ = auVar37._8_4_ * 3.4028235e+38;
      auVar45._12_4_ = auVar37._12_4_ * 3.4028235e+38;
      auVar42._0_4_ = auVar38._0_4_ * 3.4028235e+38;
      auVar42._4_4_ = auVar38._4_4_ * 3.4028235e+38;
      auVar42._8_4_ = auVar38._8_4_ * 3.4028235e+38;
      auVar42._12_4_ = auVar38._12_4_ * 3.4028235e+38;
      auVar37 = vmaxps_avx(auVar42,auVar34);
      auVar37 = vmaxps_avx(auVar45,auVar37);
      auVar36 = vmaxps_avx(auVar36,auVar37);
      auVar37 = vmovshdup_avx(auVar36);
      fVar31 = auVar37._0_4_;
      if (auVar36._0_4_ <= auVar40._0_4_) {
        uVar19 = local_2c8.nodes.
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].index.value;
        if (fVar31 <= auVar43._0_4_) {
          uVar24 = (ulong)local_198;
          if (0x3f < uVar24) {
            __assert_fail("!is_full()",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                          ,0x15,
                          "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                         );
          }
          uVar9 = local_2c8.nodes.
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].index.value;
          uVar15 = uVar9;
          uVar23 = uVar19;
          if (auVar36._0_4_ <= fVar31) {
            uVar15 = uVar19;
            uVar23 = uVar9;
          }
          uVar19 = uVar15;
          local_198 = local_198 + 1;
          *(uint *)((long)&local_298 + uVar24 * 4) = uVar23;
        }
        goto LAB_00103079;
      }
      if (fVar31 <= auVar43._0_4_) {
        uVar19 = local_2c8.nodes.
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].index.value;
        goto LAB_00103079;
      }
      if (local_198 == 0) {
LAB_00103393:
        bVar26 = local_300 == 0xffffffffffffffff;
        if (bVar26) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"No intersection found",0x15);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
          std::ostream::put(-0x30);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Intersection found\n",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  primitive: ",0xd);
          poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"  distance: ",0xc);
          poVar18 = std::ostream::_M_insert<double>((double)uStack_380._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"  barycentric coords.: ",0x17)
          ;
          poVar18 = std::ostream::_M_insert<double>((double)local_310);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
          poVar18 = std::ostream::_M_insert<double>((double)local_30c);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
        }
        if (local_358.
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_358.
                          super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_358.
                                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_358.
                                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2c8.prim_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.prim_ids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2c8.prim_ids.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.prim_ids.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2c8.nodes.
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2c8.nodes.
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2c8.nodes.
                                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2c8.nodes.
                                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((ThreadPool *)
            local_2f8.
            super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (ThreadPool *)0x0) {
          operator_delete(local_2f8.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2f8.
                                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2f8.
                                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2e0.
            super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e0.
                          super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e0.
                                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e0.
                                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ::bvh::v2::ThreadPool::~ThreadPool((ThreadPool *)local_128);
        if (local_3b8 != (void *)0x0) {
          operator_delete(local_3b8,local_3a8 - (long)local_3b8);
        }
        return (uint)bVar26;
      }
      goto LAB_00103069;
    }
    uVar25 = (ulong)(uVar19 >> 4);
    lVar16 = (ulong)(uVar19 & 0xfffffff0) * 3 + 0x18;
    lVar20 = (ulong)(uVar19 & 0xfffffff0) * 3 + 0xc;
    do {
      pBVar14 = local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_398;
      pBVar12 = local_358.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar25;
      puVar1 = (undefined1 *)
               ((long)&(pBVar12->prim_ids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4);
      local_318 = local_358.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25 + 1;
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           (pBVar12->nodes).
           super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auVar37 = vsubps_avx(auVar32,auVar35);
      fVar31 = *(float *)&(pBVar12->nodes).
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (float)uStack_390;
      auVar36 = vmovshdup_avx(auVar37);
      local_338 = (undefined1  [8])vmovlps_avx(auVar37);
      pBStack_330 = (pointer)CONCAT44(pBStack_330._4_4_,fVar31);
      auVar38 = vfmsub231ss_fma(ZEXT416((uint)(auVar36._0_4_ * fStack_384)),ZEXT416((uint)local_388)
                                ,ZEXT416((uint)fVar31));
      auVar40 = vfmsub231ss_fma(ZEXT416((uint)(fVar31 * uStack_390._4_4_)),auVar37,
                                ZEXT416((uint)fStack_384));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(auVar37._0_4_ * local_388)),
                                ZEXT416((uint)uStack_390._4_4_),auVar36);
      auVar36 = vinsertps_avx(auVar38,auVar40,0x10);
      uVar4 = vmovlps_avx(auVar36);
      local_188.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = auVar37._0_4_;
      local_188.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar4;
      fVar30 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,puVar1,local_318,(long)&uStack_390 + 4);
      pBVar12 = local_318;
      fVar31 = 0.0;
      lVar22 = 0;
      do {
        pfVar3 = (float *)((long)&local_188.
                                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar22);
        lVar13 = lVar22 + lVar16;
        lVar22 = lVar22 + 4;
        fVar31 = fVar31 + *pfVar3 * *(float *)((long)&(pBVar14->nodes).
                                                                                                            
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar13
                                              );
      } while (lVar22 != 0xc);
      fVar33 = 0.0;
      lVar22 = 0;
      do {
        pfVar3 = (float *)((long)&local_188.
                                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar22);
        lVar13 = lVar22 + lVar20;
        lVar22 = lVar22 + 4;
        fVar33 = fVar33 + *pfVar3 * *(float *)((long)&(pBVar14->nodes).
                                                                                                            
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar13
                                              );
      } while (lVar22 != 0xc);
      fVar30 = 1.0 / fVar30;
      fVar31 = fVar30 * fVar31;
      if (((-1.1920929e-07 <= fVar31) && (fVar33 = fVar30 * fVar33, -1.1920929e-07 <= fVar33)) &&
         (-1.1920929e-07 <= (1.0 - fVar31) - fVar33)) {
        local_318 = (pointer)CONCAT44(local_318._4_4_,fVar31);
        local_308 = fVar30;
        local_304 = fVar33;
        fVar31 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,puVar1,pBVar12,local_338);
        fVar31 = fVar31 * local_308;
        if (((float)uStack_380 <= fVar31) && (fVar31 <= uStack_380._4_4_)) {
          local_310 = local_318._0_4_;
          local_30c = local_304;
          uStack_380._4_4_ = fVar31;
          local_300 = uVar25;
        }
      }
      uVar25 = uVar25 + 1;
      lVar16 = lVar16 + 0x30;
      lVar20 = lVar20 + 0x30;
    } while (uVar25 != (uVar19 & 0xf) + (uVar19 >> 4));
    if (local_198 == 0) goto LAB_00103393;
  } while( true );
}

Assistant:

int main() {
    // This is the original data, which may come in some other data type/structure.
    std::vector<Tri> tris;
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3( 1.0,  1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3(-1.0, -1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );

    bvh::v2::ThreadPool thread_pool;
    bvh::v2::ParallelExecutor executor(thread_pool);

    // Get triangle centers and bounding boxes (required for BVH builder)
    std::vector<BBox> bboxes(tris.size());
    std::vector<Vec3> centers(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            bboxes[i]  = tris[i].get_bbox();
            centers[i] = tris[i].get_center();
        }
    });

    typename bvh::v2::DefaultBuilder<Node>::Config config;
    config.quality = bvh::v2::DefaultBuilder<Node>::Quality::High;
    auto bvh = bvh::v2::DefaultBuilder<Node>::build(thread_pool, bboxes, centers, config);

    // Permuting the primitive data allows to remove indirections during traversal, which makes it faster.
    static constexpr bool should_permute = true;

    // This precomputes some data to speed up traversal further.
    std::vector<PrecomputedTri> precomputed_tris(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            auto j = should_permute ? bvh.prim_ids[i] : i;
            precomputed_tris[i] = tris[j];
        }
    });

    auto ray = Ray {
        Vec3(0., 0., 0.), // Ray origin
        Vec3(0., 0., 1.), // Ray direction
        0.,               // Minimum intersection distance
        100.              // Maximum intersection distance
    };

    static constexpr size_t invalid_id = std::numeric_limits<size_t>::max();
    static constexpr size_t stack_size = 64;
    static constexpr bool use_robust_traversal = false;

    auto prim_id = invalid_id;
    Scalar u, v;

    // Traverse the BVH and get the u, v coordinates of the closest intersection.
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    bvh.intersect<false, use_robust_traversal>(ray, bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i) {
                size_t j = should_permute ? i : bvh.prim_ids[i];
                if (auto hit = precomputed_tris[j].intersect(ray)) {
                    prim_id = i;
                    std::tie(ray.tmax, u, v) = *hit;
                }
            }
            return prim_id != invalid_id;
        });

    if (prim_id != invalid_id) {
        std::cout
            << "Intersection found\n"
            << "  primitive: " << prim_id << "\n"
            << "  distance: " << ray.tmax << "\n"
            << "  barycentric coords.: " << u << ", " << v << std::endl;
        return 0;
    } else {
        std::cout << "No intersection found" << std::endl;
        return 1;
    }
}